

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::synchronization::anon_unknown_0::PipelineCacheComputeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PipelineCacheComputeTestInstance *this)

{
  VkPipelineCache pipelineCache_00;
  Context *pCVar1;
  VkDevice pVVar2;
  undefined8 uVar3;
  deUint32 x;
  qpTestResult qVar4;
  MultiQueues *pMVar5;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_00;
  Handle<(vk::HandleType)19> *pHVar6;
  Handle<(vk::HandleType)16> *pHVar7;
  Handle<(vk::HandleType)15> *pHVar8;
  reference pCreateInfo;
  Handle<(vk::HandleType)18> *pipeline_00;
  const_reference shadersExecutions;
  CreateComputeThread *this_01;
  allocator<char> local_2a1;
  string local_2a0;
  uint local_280;
  byte local_27a;
  DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread> local_279;
  VkPipelineCache local_278;
  MovePtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
  local_270;
  uint local_25c;
  undefined1 local_258 [4];
  deUint32 ndx;
  undefined1 local_230 [8];
  ThreadGroup threads;
  deUint32 numThreads;
  undefined1 local_208 [8];
  Move<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)15>_> pipelineCache;
  VkPipelineCacheCreateInfo pipelineCacheInfo;
  undefined1 local_198 [8];
  vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  pipelineInfo;
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  shaderStageInfos;
  undefined1 local_160 [8];
  Move<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  undefined1 local_f8 [8];
  Move<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_d0;
  undefined1 local_98 [8];
  Buffer resultBuffer;
  ShaderModuleVector shaderCompModules;
  VkDevice local_40;
  VkDevice device;
  undefined1 local_30 [8];
  MovePtr<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  queues;
  DeviceInterface *vk;
  PipelineCacheComputeTestInstance *this_local;
  TestStatus *thread_result;
  
  queues.
  super_UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  .m_data._8_8_ = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device._4_4_ = 2;
  createQueues((MovePtr<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                *)local_30,(this->super_TestInstance).m_context,(VkQueueFlags *)((long)&device + 4))
  ;
  pMVar5 = de::details::
           UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
           ::operator->((UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                         *)local_30);
  local_40 = MultiQueues::getDevice(pMVar5);
  addShaderModules((ShaderModuleVector *)
                   &resultBuffer.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                    field_0x8,this,&local_40);
  uVar3 = queues.
          super_UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
          .m_data._8_8_;
  pVVar2 = local_40;
  pMVar5 = de::details::
           UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
           ::operator->((UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                         *)local_30);
  allocator = de::details::UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>::operator*
                        ((UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_> *)pMVar5);
  makeBufferCreateInfo(&local_d0,0x40,0x20);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  synchronization::Buffer::Buffer
            ((Buffer *)local_98,(DeviceInterface *)uVar3,pVVar2,allocator,&local_d0,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_f8,this_00,
             (DeviceInterface *)
             queues.
             super_UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
             .m_data._8_8_,local_40,0);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator);
  uVar3 = queues.
          super_UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
          .m_data._8_8_;
  pVVar2 = local_40;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_f8);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_160,(DeviceInterface *)uVar3,
                     pVVar2,(VkDescriptorSetLayout)pHVar6->m_internal);
  addShaderStageInfo((vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                      *)&pipelineInfo.
                         super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
                     (ShaderModuleVector *)
                     &resultBuffer.m_allocation.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_160);
  addPipelineInfo((vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                   *)local_198,this,(VkPipelineLayout)pHVar7->m_internal,
                  (vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                   *)&pipelineInfo.
                      super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pipelineCache.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x11;
  ::vk::createPipelineCache
            ((Move<vk::Handle<(vk::HandleType)15>_> *)
             &pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (DeviceInterface *)
             queues.
             super_UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
             .m_data._8_8_,local_40,
             (VkPipelineCacheCreateInfo *)
             &pipelineCache.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
              m_allocator,(VkAllocationCallbacks *)0x0);
  uVar3 = queues.
          super_UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
          .m_data._8_8_;
  pVVar2 = local_40;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)15>_> *)
                      &pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                       m_allocator);
  pipelineCache_00.m_internal = pHVar8->m_internal;
  pCreateInfo = std::
                vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                ::operator[]((vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                              *)local_198,0);
  ::vk::createComputePipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_208,(DeviceInterface *)uVar3,pVVar2,
             pipelineCache_00,pCreateInfo,(VkAllocationCallbacks *)0x0);
  x = deGetNumAvailableLogicalCores();
  threads.m_threads.
  super__Vector_base<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = de::clamp<unsigned_int>(x,4,0x20);
  ThreadGroup::ThreadGroup((ThreadGroup *)local_230);
  pCVar1 = (this->super_TestInstance).m_context;
  pipeline_00 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_208);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_160);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_f8);
  pMVar5 = de::details::
           UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
           ::operator*((UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                        *)local_30);
  shadersExecutions =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                 (&this->m_shadersExecutions,0);
  executeComputePipeline
            ((TestStatus *)local_258,pCVar1,pipeline_00,pHVar7,pHVar6,pMVar5,shadersExecutions);
  tcu::TestStatus::~TestStatus((TestStatus *)local_258);
  for (local_25c = 0;
      local_25c <
      threads.m_threads.
      super__Vector_base<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_25c = local_25c + 1) {
    this_01 = (CreateComputeThread *)operator_new(0xa0);
    pCVar1 = (this->super_TestInstance).m_context;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)15>_> *)
                        &pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                         m_allocator);
    local_278.m_internal = pHVar8->m_internal;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_160);
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_f8);
    pMVar5 = de::details::
             UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
             ::operator*((UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                          *)local_30);
    CreateComputeThread::CreateComputeThread
              (this_01,pCVar1,local_278,
               (vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                *)local_198,pHVar7,pHVar6,pMVar5,&this->m_shadersExecutions);
    de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>::
    DefaultDeleter(&local_279);
    de::details::
    MovePtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_270,this_01);
    ThreadGroup::add((ThreadGroup *)local_230,&local_270);
    de::details::
    MovePtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_270);
  }
  local_27a = 0;
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_230);
  qVar4 = tcu::TestStatus::getCode(__return_storage_ptr__);
  if (qVar4 != QP_TEST_RESULT_PASS) {
    local_27a = 1;
  }
  local_280 = (uint)(qVar4 != QP_TEST_RESULT_PASS);
  if ((local_27a & 1) == 0) {
    tcu::TestStatus::~TestStatus(__return_storage_ptr__);
  }
  if (local_280 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Passed",&local_2a1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    local_280 = 1;
  }
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_230);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_208);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)15>_> *)
             &pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator);
  std::vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>::
  ~vector((vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
           *)local_198);
  std::
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::~vector((vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
             *)&pipelineInfo.
                super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_160);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_f8);
  synchronization::Buffer::~Buffer((Buffer *)local_98);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
             *)&resultBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
  de::details::
  MovePtr<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  ::~MovePtr((MovePtr<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
              *)local_30);
  return __return_storage_ptr__;
}

Assistant:

TestStatus	iterate								(void)
	{
		const DeviceInterface&					vk					= m_context.getDeviceInterface();
		MovePtr<MultiQueues>					queues				= createQueues(m_context, VK_QUEUE_COMPUTE_BIT);
		const VkDevice							device				= queues->getDevice();
		ShaderModuleVector						shaderCompModules	= addShaderModules(device);
		Buffer									resultBuffer		(vk, device, *queues->m_allocator, makeBufferCreateInfo(BUFFER_SIZE, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);
		const Move<VkDescriptorSetLayout>		descriptorSetLayout	(DescriptorSetLayoutBuilder()
																		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
																		.build(vk, device));
		const Move<VkPipelineLayout>			pipelineLayout		(makePipelineLayout(vk, device, *descriptorSetLayout));
		vector<VkPipelineShaderStageCreateInfo>	shaderStageInfos	= addShaderStageInfo(shaderCompModules);
		vector<VkComputePipelineCreateInfo>		pipelineInfo		= addPipelineInfo(*pipelineLayout, shaderStageInfos);
		const VkPipelineCacheCreateInfo			pipelineCacheInfo	=
																	{
																		VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO,	// VkStructureType             sType;
																		DE_NULL,										// const void*                 pNext;
																		0u,												// VkPipelineCacheCreateFlags  flags;
																		0u,												// deUintptr                   initialDataSize;
																		DE_NULL,										// const void*                 pInitialData;
																	};
		Move<VkPipelineCache>					pipelineCache		= createPipelineCache(vk, device, &pipelineCacheInfo);
		Move<VkPipeline>						pipeline			= createComputePipeline(vk, device, *pipelineCache, &pipelineInfo[0]);
		const deUint32							numThreads			= clamp(deGetNumAvailableLogicalCores(), 4u, 32u);
		ThreadGroup								threads;

		executeComputePipeline(m_context, *pipeline, *pipelineLayout, *descriptorSetLayout, *queues, m_shadersExecutions[0]);

		for (deUint32 ndx = 0; ndx < numThreads; ++ndx)
			threads.add(MovePtr<ThreadGroupThread>(new CreateComputeThread(
				m_context, *pipelineCache, pipelineInfo, *pipelineLayout, *descriptorSetLayout, *queues, m_shadersExecutions)));

		{
			TestStatus thread_result = threads.run();
			if(thread_result.getCode())
			{
				return thread_result;
			}
		}
		return TestStatus::pass("Passed");
	}